

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgumentParserHelper::SetResult(cmCommandArgumentParserHelper *this,char *value)

{
  char *value_local;
  cmCommandArgumentParserHelper *this_local;
  
  if (value == (char *)0x0) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::operator=((string *)&this->Result,value);
  }
  return;
}

Assistant:

void cmCommandArgumentParserHelper::SetResult(const char* value)
{
  if (!value) {
    this->Result.clear();
    return;
  }
  this->Result = value;
}